

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O2

void __thiscall UnitTest::runAll(UnitTest *this)

{
  pointer ppBVar1;
  BaseCase *pBVar2;
  ostream *poVar3;
  vector<BaseCase_*,_std::allocator<BaseCase_*>_> *__range1;
  pointer ppBVar4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,">>> running ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," tests...");
  std::endl<char,std::char_traits<char>>(poVar3);
  ppBVar1 = (this->test_cases_).super__Vector_base<BaseCase_*,_std::allocator<BaseCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->test_cases_).super__Vector_base<BaseCase_*,_std::allocator<BaseCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1; ppBVar4 = ppBVar4 + 1
      ) {
    pBVar2 = *ppBVar4;
    this->current_case_ = pBVar2;
    (**pBVar2->_vptr_BaseCase)();
  }
  return;
}

Assistant:

void runAll()
    {
        std::cout << ">>> running " << test_cases_.size() << " tests..." << std::endl;
        for(BaseCase* test : test_cases_)
        {
            current_case_ = test;
            current_case_->run();
        }
    }